

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearray.h
# Opt level: O2

char * __thiscall QByteArray::data(QByteArray *this)

{
  detach(this);
  return (this->d).ptr;
}

Assistant:

inline char *QByteArray::data()
{
    detach();
    Q_ASSERT(d.data());
    return d.data();
}